

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

bool __thiscall
args::ArgumentParser::
Complete<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (ArgumentParser *this,
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          it,__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             end)

{
  char __rhs;
  size_type sVar1;
  int iVar2;
  OptionType OVar3;
  undefined4 extraout_var;
  Completion *this_01;
  char *pcVar4;
  undefined4 extraout_var_00;
  ulong uVar5;
  undefined4 extraout_var_01;
  iterator __end6;
  Matcher *this_02;
  _Alloc_hider _Var6;
  pointer pbVar7;
  iterator __begin4;
  pointer ppCVar8;
  iterator __begin6;
  string *psVar9;
  bool bVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  choices;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  string arg;
  string local_a8;
  pointer local_88;
  pointer local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_> flags;
  vector<args::Command_*,_std::allocator<args::Command_*>_> commands;
  NamedBase *this_00;
  
  if ((this->readCompletion & it._M_current + 1 == end._M_current) == 0) {
    return false;
  }
  iVar2 = (*(this->super_Command).super_Group.super_Base._vptr_Base[8])();
  this_00 = (NamedBase *)CONCAT44(extraout_var,iVar2);
  (*(this->super_Command).super_Group.super_Base._vptr_Base[5])(&commands,this);
  OVar3 = ParseOption(this,it._M_current,true);
  if (commands.super__Vector_base<args::Command_*,_std::allocator<args::Command_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      commands.super__Vector_base<args::Command_*,_std::allocator<args::Command_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    if ((this_00 != (NamedBase *)0x0) &&
       (((this_00->super_Base).options & HiddenFromCompletion) == None)) {
      NamedBase::HelpChoices_abi_cxx11_(&choices,this_00,&this->helpParams);
      pbVar7 = choices.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      psVar9 = (string *)
               CONCAT62(choices.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start._2_6_,
                        CONCAT11(choices.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                 choices.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start._0_1_));
      bVar10 = psVar9 == choices.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
      for (; psVar9 != pbVar7; psVar9 = psVar9 + 1) {
        AddCompletionReply(this,it._M_current,psVar9);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&choices);
      if (OVar3 == Positional && bVar10) goto LAB_0019583f;
    }
  }
  else {
    ppCVar8 = commands.super__Vector_base<args::Command_*,_std::allocator<args::Command_*>_>._M_impl
              .super__Vector_impl_data._M_start;
    if ((OVar3 == Positional) || ((it._M_current)->_M_string_length == 0)) {
      for (; ppCVar8 !=
             commands.super__Vector_base<args::Command_*,_std::allocator<args::Command_*>_>._M_impl.
             super__Vector_impl_data._M_finish; ppCVar8 = ppCVar8 + 1) {
        if ((((*ppCVar8)->super_Group).super_Base.options & HiddenFromCompletion) == None) {
          AddCompletionReply(this,it._M_current,&(*ppCVar8)->name);
        }
      }
      goto LAB_0019583f;
    }
    for (; ppCVar8 !=
           commands.super__Vector_base<args::Command_*,_std::allocator<args::Command_*>_>._M_impl.
           super__Vector_impl_data._M_finish; ppCVar8 = ppCVar8 + 1) {
      if ((((*ppCVar8)->super_Group).super_Base.options & HiddenFromCompletion) == None) {
        AddCompletionReply(this,it._M_current,&(*ppCVar8)->name);
      }
    }
  }
  (*(this->super_Command).super_Group.super_Base._vptr_Base[9])(&flags,this);
  local_88 = flags.super__Vector_base<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  psVar9 = &this->shortprefix;
  while (flags.super__Vector_base<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>._M_impl.
         super__Vector_impl_data._M_start != local_88) {
    local_80 = flags.super__Vector_base<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    if ((((*flags.super__Vector_base<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>._M_impl.
            super__Vector_impl_data._M_start)->super_NamedBase).super_Base.options &
        HiddenFromCompletion) == None) {
      this_02 = &(*flags.super__Vector_base<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>.
                   _M_impl.super__Vector_impl_data._M_start)->matcher;
      Matcher::GetShortOrAny((EitherFlag *)&choices,this_02);
      EitherFlag::str(&arg,(EitherFlag *)&choices,psVar9,&this->longprefix);
      bVar10 = AddCompletionReply(this,it._M_current,&arg);
      std::__cxx11::string::~string((string *)&arg);
      std::__cxx11::string::~string
                ((string *)
                 &choices.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
      if (!bVar10) {
        Matcher::GetFlagStrings
                  ((vector<args::EitherFlag,_std::allocator<args::EitherFlag>_> *)&arg,this_02);
        sVar1 = arg._M_string_length;
        _Var6 = arg._M_dataplus;
        do {
          if (_Var6._M_p == (pointer)sVar1) break;
          EitherFlag::str((string *)&choices,(EitherFlag *)_Var6._M_p,psVar9,&this->longprefix);
          bVar10 = AddCompletionReply(this,it._M_current,(string *)&choices);
          std::__cxx11::string::~string((string *)&choices);
          _Var6._M_p = _Var6._M_p + 0x28;
        } while (!bVar10);
        std::vector<args::EitherFlag,_std::allocator<args::EitherFlag>_>::~vector
                  ((vector<args::EitherFlag,_std::allocator<args::EitherFlag>_> *)&arg);
      }
    }
    flags.super__Vector_base<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>._M_impl.
    super__Vector_impl_data._M_start = local_80 + 1;
  }
  if (OVar3 == LongFlag) {
    if ((this->allowJoinedLongValue == true) && ((this->longseparator)._M_string_length != 0)) {
      uVar5 = std::__cxx11::string::find((string *)it._M_current,(ulong)&this->longseparator);
      if (uVar5 != 0xffffffffffffffff) {
        std::__cxx11::string::string((string *)&arg,(string *)it._M_current,0,uVar5);
        std::__cxx11::string::substr((ulong)&local_a8,(ulong)&arg);
        EitherFlag::EitherFlag((EitherFlag *)&choices,&local_a8);
        iVar2 = (*(this->super_Command).super_Group.super_Base._vptr_Base[7])(this,&choices);
        std::__cxx11::string::~string
                  ((string *)
                   &choices.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
        std::__cxx11::string::~string((string *)&local_a8);
        if ((NamedBase *)CONCAT44(extraout_var_01,iVar2) != (NamedBase *)0x0) {
          NamedBase::HelpChoices_abi_cxx11_
                    (&local_78,(NamedBase *)CONCAT44(extraout_var_01,iVar2),&this->helpParams);
          for (pbVar7 = local_78.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pbVar7 != local_78.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish; pbVar7 = pbVar7 + 1) {
            std::operator+(&local_a8,&arg,&this->longseparator);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &choices,&local_a8,pbVar7);
            AddCompletionReply(this,it._M_current,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &choices);
            std::__cxx11::string::~string((string *)&choices);
            std::__cxx11::string::~string((string *)&local_a8);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_78);
        }
        std::__cxx11::string::~string((string *)&arg);
      }
    }
  }
  else if (((OVar3 == ShortFlag) && (this->allowJoinedShortValue == true)) &&
          ((this->shortprefix)._M_string_length + 1 < (it._M_current)->_M_string_length)) {
    pcVar4 = (char *)std::__cxx11::string::at((ulong)it._M_current);
    __rhs = *pcVar4;
    choices.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_1_ = 1;
    choices.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)&local_d8;
    choices.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d8._M_local_buf[0] = '\0';
    choices.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._1_1_ = __rhs;
    iVar2 = (*(this->super_Command).super_Group.super_Base._vptr_Base[7])(this,&choices);
    std::__cxx11::string::~string
              ((string *)
               &choices.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
    if ((NamedBase *)CONCAT44(extraout_var_00,iVar2) != (NamedBase *)0x0) {
      NamedBase::HelpChoices_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_a8,(NamedBase *)CONCAT44(extraout_var_00,iVar2),&this->helpParams);
      for (_Var6._M_p = local_a8._M_dataplus._M_p; _Var6._M_p != (pointer)local_a8._M_string_length;
          _Var6._M_p = _Var6._M_p + 0x20) {
        std::operator+(&arg,psVar9,__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&choices
                       ,&arg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             _Var6._M_p);
        AddCompletionReply(this,it._M_current,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &choices);
        std::__cxx11::string::~string((string *)&choices);
        std::__cxx11::string::~string((string *)&arg);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_a8);
    }
  }
  std::_Vector_base<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>::~_Vector_base
            (&flags.super__Vector_base<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>);
LAB_0019583f:
  this_01 = (Completion *)__cxa_allocate_exception(0x10);
  CompletionFlag::Get_abi_cxx11_((string *)&choices,this->completion);
  Completion::Completion(this_01,(string *)&choices);
  __cxa_throw(this_01,&Completion::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool Complete(It it, It end)
            {
                auto nextIt = it;
                if (!readCompletion || (++nextIt != end))
                {
                    return false;
                }

                const auto &chunk = *it;
                auto pos = GetNextPositional();
                std::vector<Command *> commands = GetCommands();
                const auto optionType = ParseOption(chunk, true);

                if (!commands.empty() && (chunk.empty() || optionType == OptionType::Positional))
                {
                    for (auto &cmd : commands)
                    {
                        if ((cmd->GetOptions() & Options::HiddenFromCompletion) == Options::None)
                        {
                            AddCompletionReply(chunk, cmd->Name());
                        }
                    }
                } else
                {
                    bool hasPositionalCompletion = true;

                    if (!commands.empty())
                    {
                        for (auto &cmd : commands)
                        {
                            if ((cmd->GetOptions() & Options::HiddenFromCompletion) == Options::None)
                            {
                                AddCompletionReply(chunk, cmd->Name());
                            }
                        }
                    } else if (pos)
                    {
                        if ((pos->GetOptions() & Options::HiddenFromCompletion) == Options::None)
                        {
                            auto choices = pos->HelpChoices(helpParams);
                            hasPositionalCompletion = !choices.empty() || optionType != OptionType::Positional;
                            for (auto &choice : choices)
                            {
                                AddCompletionReply(chunk, choice);
                            }
                        }
                    }

                    if (hasPositionalCompletion)
                    {
                        auto flags = GetAllFlags();
                        for (auto flag : flags)
                        {
                            if ((flag->GetOptions() & Options::HiddenFromCompletion) != Options::None)
                            {
                                continue;
                            }

                            auto &matcher = flag->GetMatcher();
                            if (!AddCompletionReply(chunk, matcher.GetShortOrAny().str(shortprefix, longprefix)))
                            {
                                for (auto &flagName : matcher.GetFlagStrings())
                                {
                                    if (AddCompletionReply(chunk, flagName.str(shortprefix, longprefix)))
                                    {
                                        break;
                                    }
                                }
                            }
                        }

                        if (optionType == OptionType::LongFlag && allowJoinedLongValue)
                        {
                            const auto separator = longseparator.empty() ? chunk.npos : chunk.find(longseparator);
                            if (separator != chunk.npos)
                            {
                                std::string arg(chunk, 0, separator);
                                if (auto flag = this->Match(arg.substr(longprefix.size())))
                                {
                                    for (auto &choice : flag->HelpChoices(helpParams))
                                    {
                                        AddCompletionReply(chunk, arg + longseparator + choice);
                                    }
                                }
                            }
                        } else if (optionType == OptionType::ShortFlag && allowJoinedShortValue)
                        {
                            if (chunk.size() > shortprefix.size() + 1)
                            {
                                auto arg = chunk.at(shortprefix.size());
                                //TODO: support -abcVALUE where a and b take no value
                                if (auto flag = this->Match(arg))
                                {
                                    for (auto &choice : flag->HelpChoices(helpParams))
                                    {
                                        AddCompletionReply(chunk, shortprefix + arg + choice);
                                    }
                                }
                            }
                        }
                    }
                }

#ifndef ARGS_NOEXCEPT
                throw Completion(completion->Get());
#else
                return true;
#endif
            }